

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

StringPtr __thiscall capnp::Schema::getUnqualifiedName(Schema *this)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Reader RVar6;
  StringPtr SVar7;
  Reader proto;
  StructReader local_68;
  PointerReader local_38;
  
  local_38.pointer = (WirePointer *)this->raw->generic->encodedNode;
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  uVar1 = 0;
  _::PointerReader::getStruct(&local_68,&local_38,(word *)0x0);
  local_38.pointer = (WirePointer *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  if (local_68.pointerCount != 0) {
    local_38.pointer = local_68.pointers;
    local_38.nestingLimit = local_68.nestingLimit;
  }
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  if (local_68.pointerCount != 0) {
    uVar2 = local_68.segment._0_4_;
    uVar3 = local_68.segment._4_4_;
    uVar4 = local_68.capTable._0_4_;
    uVar5 = local_68.capTable._4_4_;
  }
  local_38.segment = (SegmentReader *)CONCAT44(uVar3,uVar2);
  local_38.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  RVar6 = _::PointerReader::getBlob<capnp::Text>(&local_38,(void *)0x0,0);
  if (0x5f < local_68.dataSize) {
    uVar1 = (ulong)*(uint *)((long)local_68.data + 8);
  }
  SVar7.content.ptr = RVar6.super_StringPtr.content.ptr + uVar1;
  SVar7.content.size_ = RVar6.super_StringPtr.content.size_ - uVar1;
  return (StringPtr)SVar7.content;
}

Assistant:

schema::Node::Reader Schema::getProto() const {
  return readMessageUnchecked<schema::Node>(raw->generic->encodedNode);
}